

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O0

PSpriteAmiga __thiscall
DataSourceAmiga::decode_interlased_sprite
          (DataSourceAmiga *this,PBuffer *data,size_t width,size_t height,uint8_t compression,
          uint8_t filling,uint8_t *palette,size_t skip_lines)

{
  byte bVar1;
  uint uVar2;
  element_type *this_00;
  element_type *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined7 in_register_00000081;
  PSpriteAmiga PVar4;
  long in_stack_00000018;
  ulong local_90;
  size_t b;
  byte local_7d;
  int n;
  uint8_t color;
  ulong uStack_78;
  int k;
  size_t i;
  size_t y;
  size_t bpp;
  Color *res;
  void *local_48;
  uint8_t *src;
  undefined1 local_32;
  byte local_31;
  ulong uStack_30;
  uint8_t compression_local;
  size_t height_local;
  size_t width_local;
  PBuffer *data_local;
  DataSourceAmiga *this_local;
  PSpriteAmiga *sprite;
  
  uStack_30 = CONCAT71(in_register_00000081,compression);
  local_32 = 0;
  src = (uint8_t *)(height << 3);
  local_31 = filling;
  height_local = height;
  width_local = width;
  data_local = data;
  this_local = this;
  std::make_shared<DataSourceAmiga::SpriteAmiga,unsigned_long,unsigned_long&>
            ((unsigned_long *)this,(unsigned_long *)&src);
  this_00 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       width);
  local_48 = Buffer::get_data(this_00);
  this_01 = std::
            __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  bpp = (size_t)SpriteAmiga::get_writable_data(this_01);
  uVar2 = bitplane_count_from_compression((DataSourceAmiga *)data,local_31);
  _Var3._M_pi = extraout_RDX;
  for (i = 0; i < uStack_30; i = i + 1) {
    for (uStack_78 = 0; uStack_78 < height_local; uStack_78 = uStack_78 + 1) {
      for (n = 7; -1 < n; n = n + -1) {
        local_7d = 0;
        b._4_4_ = 0;
        for (local_90 = 0; local_90 < 5; local_90 = local_90 + 1) {
          local_7d = local_7d << 1;
          if (((int)(uint)local_31 >> ((byte)local_90 & 0x1f) & 1U) == 0) {
            local_7d = local_7d |
                       (byte)((int)(uint)*(byte *)((long)local_48 +
                                                  in_stack_00000018 * height_local * i +
                                                  (long)b._4_4_ * height_local) >> ((byte)n & 0x1f))
                       & 1;
            b._4_4_ = b._4_4_ + 1;
          }
          else if (((int)(uint)(byte)palette >> ((byte)local_90 & 0x1f) & 1U) != 0) {
            local_7d = local_7d | 1;
          }
        }
        bVar1 = invert5bit(local_7d);
        *(undefined1 *)(bpp + 2) = *(undefined1 *)(skip_lines + (long)(int)((uint)bVar1 * 3));
        *(undefined1 *)(bpp + 1) = *(undefined1 *)(skip_lines + (long)(int)((uint)bVar1 * 3 + 1));
        *(undefined1 *)bpp = *(undefined1 *)(skip_lines + (long)(int)((uint)bVar1 * 3 + 2));
        *(undefined1 *)(bpp + 3) = 0xff;
        bpp = bpp + 4;
        _Var3._M_pi = extraout_RDX_00;
      }
      local_48 = (void *)((long)local_48 + 1);
    }
    local_48 = (void *)(((ulong)uVar2 - 1) * height_local + (long)local_48);
  }
  PVar4.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  PVar4.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (PSpriteAmiga)
         PVar4.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::decode_interlased_sprite(PBuffer data, size_t width,
                                          size_t height,
                                          uint8_t compression,
                                          uint8_t filling,
                                          uint8_t *palette,
                                          size_t skip_lines) {
  PSpriteAmiga sprite = std::make_shared<SpriteAmiga>(width*8, height);

  uint8_t *src = reinterpret_cast<uint8_t*>(data->get_data());
  Data::Sprite::Color *res = sprite->get_writable_data();

  size_t bpp = bitplane_count_from_compression(compression);

  for (size_t y = 0; y < height; y++) {
    for (size_t i = 0; i < width; i++) {
      for (int k = 7; k >= 0; k--) {
        uint8_t color = 0;
        int n = 0;
        for (size_t b = 0; b < 5; b++) {
          color = color << 1;
          if ((compression >> b) & 0x01) {
            if ((filling >> b) & 0x01) {
              color |= 0x01;
            }
          } else {
            color |= ((*(src+(n*width)+((skip_lines*width*y))) >> k) & 0x01);
            n++;
          }
        }
        color = invert5bit(color);
        res->red = palette[color*3+0];    // R
        res->green = palette[color*3+1];  // G
        res->blue = palette[color*3+2];   // B
        res->alpha = 0xFF;                // A
        res++;
      }
      src++;
    }
    src += (bpp-1) * width;
  }

  return sprite;
}